

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

mbedtls_ssl_mode_t mbedtls_ssl_get_mode_from_ciphersuite(mbedtls_ssl_ciphersuite_t *suite)

{
  mbedtls_cipher_mode_t mode;
  mbedtls_ssl_mode_t mVar1;
  mbedtls_cipher_info_t *info;
  int encrypt_then_mac;
  mbedtls_cipher_info_t *cipher;
  mbedtls_ssl_mode_t base_mode;
  mbedtls_ssl_ciphersuite_t *suite_local;
  
  cipher._4_4_ = MBEDTLS_SSL_MODE_STREAM;
  info = mbedtls_cipher_info_from_type((uint)suite->cipher);
  if (info != (mbedtls_cipher_info_t *)0x0) {
    mode = mbedtls_cipher_info_get_mode(info);
    cipher._4_4_ = mbedtls_ssl_get_base_mode(mode);
  }
  mVar1 = mbedtls_ssl_get_actual_mode(cipher._4_4_,0);
  return mVar1;
}

Assistant:

mbedtls_ssl_mode_t mbedtls_ssl_get_mode_from_ciphersuite(
#if defined(MBEDTLS_SSL_SOME_SUITES_USE_CBC_ETM)
    int encrypt_then_mac,
#endif /* MBEDTLS_SSL_SOME_SUITES_USE_CBC_ETM */
    const mbedtls_ssl_ciphersuite_t *suite)
{
    mbedtls_ssl_mode_t base_mode = MBEDTLS_SSL_MODE_STREAM;

#if defined(MBEDTLS_USE_PSA_CRYPTO)
    psa_status_t status;
    psa_algorithm_t alg;
    psa_key_type_t type;
    size_t size;
    status = mbedtls_ssl_cipher_to_psa(suite->cipher, 0, &alg, &type, &size);
    if (status == PSA_SUCCESS) {
        base_mode = mbedtls_ssl_get_base_mode(alg);
    }
#else
    const mbedtls_cipher_info_t *cipher =
        mbedtls_cipher_info_from_type((mbedtls_cipher_type_t) suite->cipher);
    if (cipher != NULL) {
        base_mode =
            mbedtls_ssl_get_base_mode(
                mbedtls_cipher_info_get_mode(cipher));
    }
#endif /* MBEDTLS_USE_PSA_CRYPTO */

#if !defined(MBEDTLS_SSL_SOME_SUITES_USE_CBC_ETM)
    int encrypt_then_mac = 0;
#endif
    return mbedtls_ssl_get_actual_mode(base_mode, encrypt_then_mac);
}